

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void Js::JavascriptArray::InsertionSort<unsigned_short>
               (unsigned_short *list,uint32 length,CompareVarsInfo *cvInfo)

{
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *p_Var1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_short local_32 [4];
  unsigned_short item;
  
  if (1 < length) {
    p_Var1 = cvInfo->compareType;
    uVar5 = 1;
    do {
      local_32[0] = list[uVar5];
      bVar3 = (*p_Var1)(cvInfo,local_32,list + (uVar5 - 1));
      uVar8 = uVar5 & 0xffffffff;
      if (bVar3) {
        uVar8 = 0;
      }
      uVar9 = (ulong)((int)uVar5 - 1);
      if (!bVar3) {
        uVar9 = uVar5 & 0xffffffff;
      }
      while( true ) {
        uVar7 = (uint)uVar8;
        uVar2 = uVar5;
        if ((uint)uVar9 <= uVar7) break;
        uVar4 = (uint)uVar9 - uVar7 >> 1;
        uVar6 = uVar4 + uVar7;
        bVar3 = (*p_Var1)(cvInfo,local_32,list + uVar6);
        if (bVar3) {
          uVar9 = (ulong)uVar6;
        }
        else {
          uVar8 = (ulong)(uVar7 + uVar4 + 1);
        }
      }
      for (; uVar8 < uVar2; uVar2 = uVar2 - 1) {
        list[uVar2] = list[uVar2 - 1];
      }
      list[uVar8] = local_32[0];
      uVar5 = uVar5 + 1;
    } while (uVar5 != length);
  }
  return;
}

Assistant:

void JavascriptArray::InsertionSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        uint32 sortedCount = 1, lowerBound = 0, insertPoint = 0, upperBound = 0;
        T item;
        while (sortedCount < length)
        {
            item = list[sortedCount];
            upperBound = sortedCount;
            insertPoint = sortedCount - 1; // this lets us check for already ordered first
            lowerBound = 0;
            for (;;)
            {
                if (compareType (cvInfo, &item, &list[insertPoint]) )
                {
                    upperBound = insertPoint;
                }
                else
                {
                    lowerBound = insertPoint + 1;
                }
                if (lowerBound >= upperBound)
                {
                    break;
                }
                insertPoint = lowerBound + ((upperBound - lowerBound) / 2);
            }
            insertPoint = sortedCount;
            while (insertPoint > lowerBound)
            {
                list[insertPoint] = list[insertPoint - 1];
                --insertPoint;
            }
            list[lowerBound] = item;
            ++sortedCount;
        }
    }